

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O0

size_t MPIU_Segmenter_collect_sizes(size_t localsize,size_t *sizes,size_t *myoffset,MPI_Comm comm)

{
  int local_44;
  int i;
  MPI_Datatype MPI_PTRDIFFT;
  size_t totalsize;
  int NTask;
  int ThisTask;
  MPI_Comm comm_local;
  size_t *myoffset_local;
  size_t *sizes_local;
  size_t localsize_local;
  
  _NTask = comm;
  comm_local = (MPI_Comm)myoffset;
  myoffset_local = sizes;
  sizes_local = (size_t *)localsize;
  MPI_Comm_size(comm,&totalsize);
  MPI_Comm_rank(_NTask,(long)&totalsize + 4);
  myoffset_local[totalsize._4_4_] = (size_t)sizes_local;
  MPI_Allreduce(myoffset_local + totalsize._4_4_,&MPI_PTRDIFFT,1,&ompi_mpi_long,&ompi_mpi_op_sum,
                _NTask);
  MPI_Allgather(1,0,&ompi_mpi_datatype_null,myoffset_local,1,&ompi_mpi_long,_NTask);
  *(undefined8 *)comm_local = 0;
  for (local_44 = 0; local_44 < totalsize._4_4_; local_44 = local_44 + 1) {
    *(size_t *)comm_local = myoffset_local[local_44] + *(long *)comm_local;
  }
  return (size_t)MPI_PTRDIFFT;
}

Assistant:

size_t
MPIU_Segmenter_collect_sizes(size_t localsize, size_t * sizes, size_t * myoffset, MPI_Comm comm)
{

    int ThisTask, NTask;

    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);

    size_t totalsize;

    sizes[ThisTask] = localsize;

    MPI_Datatype MPI_PTRDIFFT;

    if(sizeof(ptrdiff_t) == sizeof(long)) {
        MPI_PTRDIFFT = MPI_LONG;
    } else if(sizeof(ptrdiff_t) == sizeof(int)) {
        MPI_PTRDIFFT = MPI_INT;
    } else { abort(); }

    MPI_Allreduce(&sizes[ThisTask], &totalsize, 1, MPI_PTRDIFFT, MPI_SUM, comm);
    MPI_Allgather(MPI_IN_PLACE, 0, MPI_DATATYPE_NULL, sizes, 1, MPI_PTRDIFFT, comm);

    int i;
    *myoffset = 0;
    for(i = 0; i < ThisTask; i ++) {
        (*myoffset) += sizes[i];
    }

    return totalsize;
}